

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ExprCodeAtInit(Parse *pParse,Expr *pExpr,int regDest)

{
  ExprList_item *pEVar1;
  int iVar2;
  Expr *pExpr_00;
  ExprList *pEVar3;
  ExprList_item *pItem_1;
  ExprList_item *pEStack_38;
  int i;
  ExprList_item *pItem;
  ExprList *p;
  int regDest_local;
  Expr *pExpr_local;
  Parse *pParse_local;
  
  pEVar3 = pParse->pConstExpr;
  if ((regDest < 0) && (pEVar3 != (ExprList *)0x0)) {
    pEStack_38 = pEVar3->a;
    for (pItem_1._4_4_ = pEVar3->nExpr; 0 < pItem_1._4_4_; pItem_1._4_4_ = pItem_1._4_4_ + -1) {
      if ((((byte)pEStack_38->field_0x19 >> 2 & 1) != 0) &&
         (iVar2 = sqlite3ExprCompare(pEStack_38->pExpr,pExpr,-1), iVar2 == 0)) {
        return (pEStack_38->u).iConstExprReg;
      }
      pEStack_38 = pEStack_38 + 1;
    }
  }
  pExpr_00 = sqlite3ExprDup(pParse->db,pExpr,0);
  pEVar3 = sqlite3ExprListAppend(pParse,pEVar3,pExpr_00);
  p._4_4_ = regDest;
  if (pEVar3 != (ExprList *)0x0) {
    pEVar1 = pEVar3->a;
    iVar2 = pEVar3->nExpr + -1;
    pEVar1[iVar2].field_0x19 = pEVar1[iVar2].field_0x19 & 0xfb | (regDest < 0) << 2;
    if (regDest < 0) {
      p._4_4_ = pParse->nMem + 1;
      pParse->nMem = p._4_4_;
    }
    pEVar1[iVar2].u.iConstExprReg = p._4_4_;
  }
  pParse->pConstExpr = pEVar3;
  return p._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCodeAtInit(
  Parse *pParse,    /* Parsing context */
  Expr *pExpr,      /* The expression to code when the VDBE initializes */
  int regDest       /* Store the value in this register */
){
  ExprList *p;
  assert( ConstFactorOk(pParse) );
  p = pParse->pConstExpr;
  if( regDest<0 && p ){
    struct ExprList_item *pItem;
    int i;
    for(pItem=p->a, i=p->nExpr; i>0; pItem++, i--){
      if( pItem->reusable && sqlite3ExprCompare(pItem->pExpr,pExpr,-1)==0 ){
        return pItem->u.iConstExprReg;
      }
    }
  }
  pExpr = sqlite3ExprDup(pParse->db, pExpr, 0);
  p = sqlite3ExprListAppend(pParse, p, pExpr);
  if( p ){
     struct ExprList_item *pItem = &p->a[p->nExpr-1];
     pItem->reusable = regDest<0;
     if( regDest<0 ) regDest = ++pParse->nMem;
     pItem->u.iConstExprReg = regDest;
  }
  pParse->pConstExpr = p;
  return regDest;
}